

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QStringList * __thiscall QAccessibleToolButton::actionNames(QAccessibleToolButton *this)

{
  long lVar1;
  bool bVar2;
  ToolButtonPopupMode TVar3;
  QMenu *pQVar4;
  QToolButton *in_RDI;
  long in_FS_OFFSET;
  QStringList *names;
  QToolButton *in_stack_ffffffffffffffa8;
  QToolButton *this_00;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  *(Data **)&(in_RDI->super_QAbstractButton).super_QWidget = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(QString **)&(in_RDI->super_QAbstractButton).super_QWidget.field_0x8 =
       (QString *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x7eeb21);
  QAccessibleWidget::widget((QAccessibleWidget *)0x7eeb2b);
  bVar2 = QWidget::isEnabled((QWidget *)0x7eeb33);
  if (bVar2) {
    toolButton((QAccessibleToolButton *)0x7eeb43);
    pQVar4 = QToolButton::menu(in_stack_ffffffffffffffa8);
    if (pQVar4 != (QMenu *)0x0) {
      QAccessibleActionInterface::showMenuAction();
      QList<QString>::operator<<
                ((QList<QString> *)this_00,(parameter_type)in_stack_ffffffffffffffa8);
    }
    toolButton((QAccessibleToolButton *)0x7eeb6d);
    TVar3 = QToolButton::popupMode(this_00);
    if (TVar3 != InstantPopup) {
      QAccessibleButton::actionNames((QAccessibleButton *)CONCAT17(uVar5,in_stack_ffffffffffffffc8))
      ;
      QList<QString>::operator<<
                ((QList<QString> *)this_00,(QList<QString> *)in_stack_ffffffffffffffa8);
      QList<QString>::~QList((QList<QString> *)0x7eeba2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAccessibleToolButton::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
#if QT_CONFIG(menu)
        if (toolButton()->menu())
            names << showMenuAction();
        if (toolButton()->popupMode() != QToolButton::InstantPopup)
            names << QAccessibleButton::actionNames();
#endif
    }
    return names;
}